

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::DisallowedType(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                 *this,Context *context,ValueType *actualType)

{
  ErrorHandlerType *pEVar1;
  uint uVar2;
  ValueType *pVVar3;
  
  pEVar1 = context->error_handler;
  (*pEVar1->_vptr_IValidationErrorHandler[0x20])(pEVar1);
  uVar2 = this->type_;
  if ((uVar2 & 1) != 0) {
    pVVar3 = switchD_0014a871::default();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
    uVar2 = this->type_;
  }
  if ((uVar2 & 2) != 0) {
    pVVar3 = GetBooleanString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
    uVar2 = this->type_;
  }
  if ((uVar2 & 4) != 0) {
    pVVar3 = GetObjectString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
    uVar2 = this->type_;
  }
  if ((uVar2 & 8) != 0) {
    pVVar3 = GetArrayString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
    uVar2 = this->type_;
  }
  if ((uVar2 & 0x10) != 0) {
    pVVar3 = GetStringString();
    (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
    uVar2 = this->type_;
  }
  if ((uVar2 & 0x20) == 0) {
    if ((uVar2 & 0x40) == 0) goto LAB_0014d52c;
    pVVar3 = GetIntegerString();
  }
  else {
    pVVar3 = GetNumberString();
  }
  (*pEVar1->_vptr_IValidationErrorHandler[0x21])(pEVar1,pVVar3);
LAB_0014d52c:
  (*pEVar1->_vptr_IValidationErrorHandler[0x22])(pEVar1,actualType);
  return;
}

Assistant:

void DisallowedType(Context& context, const ValueType& actualType) const {
        ErrorHandler& eh = context.error_handler;
        eh.StartDisallowedType();

        if (type_ & (1 << kNullSchemaType)) eh.AddExpectedType(GetNullString());
        if (type_ & (1 << kBooleanSchemaType)) eh.AddExpectedType(GetBooleanString());
        if (type_ & (1 << kObjectSchemaType)) eh.AddExpectedType(GetObjectString());
        if (type_ & (1 << kArraySchemaType)) eh.AddExpectedType(GetArrayString());
        if (type_ & (1 << kStringSchemaType)) eh.AddExpectedType(GetStringString());

        if (type_ & (1 << kNumberSchemaType)) eh.AddExpectedType(GetNumberString());
        else if (type_ & (1 << kIntegerSchemaType)) eh.AddExpectedType(GetIntegerString());

        eh.EndDisallowedType(actualType);
    }